

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.cpp
# Opt level: O2

void license::generatePk(string *private_include,string *public_include)

{
  ostream *poVar1;
  long *local_40;
  string pubKey;
  
  CryptoHelper::getInstance();
  (**(code **)*local_40)();
  (**(code **)(*local_40 + 0x10))(&pubKey);
  write_pubkey_file(public_include,&pubKey);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"PublicKey");
  poVar1 = std::operator<<(poVar1,pubKey._M_dataplus._M_p);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&pubKey);
  (**(code **)(*local_40 + 8))(&pubKey);
  write_privkey_file(private_include,&pubKey);
  std::__cxx11::string::~string((string *)&pubKey);
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 0x28))();
  }
  return;
}

Assistant:

void generatePk(string private_include, string public_include) {
	unique_ptr<CryptoHelper> cryptoHlpr = CryptoHelper::getInstance();

	try {
		cryptoHlpr->generateKeyPair();
	} catch (exception &e) {
		cerr << endl << "Error generating key pair: " << e.what() << endl
				<< "aborting" << endl;
		exit(2);
	}

	try {
		const string pubKey = cryptoHlpr->exportPublicKey();
		write_pubkey_file(public_include, pubKey);
		// Print out the public key to console as a
		// hexadecimal string.
		cout << endl << "PublicKey" << pubKey.c_str() << endl;
	} catch (exception &e) {
		cerr << endl << "Error exporting public key: " << e.what() << endl
				<< "aborting." << endl;
		exit(4);
	}

	try {
		const string privKey = cryptoHlpr->exportPrivateKey();
		write_privkey_file(private_include, privKey);
	} catch (exception &e) {
		cerr << endl << "Error exporting private key: " << e.what() << endl
				<< "aborting" << endl;
		exit(5);
	}

	return;
}